

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O3

void __thiscall testing::Sequence::AddExpectation(Sequence *this,Expectation *expectation)

{
  ExpectationBase *pEVar1;
  ExpectationBase *pEVar2;
  linked_ptr<testing::internal::ExpectationBase> *this_00;
  
  this_00 = &((this->last_expectation_).value_)->expectation_base_;
  pEVar1 = ((linked_ptr<testing::internal::ExpectationBase> *)&this_00->value_)->value_;
  pEVar2 = (expectation->expectation_base_).value_;
  if (pEVar1 != pEVar2) {
    if (pEVar1 != (ExpectationBase *)0x0) {
      std::
      _Rb_tree<testing::Expectation,testing::Expectation,std::_Identity<testing::Expectation>,testing::Expectation::Less,std::allocator<testing::Expectation>>
      ::_M_insert_unique<testing::Expectation_const&>
                ((_Rb_tree<testing::Expectation,testing::Expectation,std::_Identity<testing::Expectation>,testing::Expectation::Less,std::allocator<testing::Expectation>>
                  *)&pEVar2->immediate_prerequisites_,(Expectation *)this_00);
      this_00 = &((this->last_expectation_).value_)->expectation_base_;
    }
    internal::linked_ptr<testing::internal::ExpectationBase>::operator=
              (this_00,&expectation->expectation_base_);
    return;
  }
  return;
}

Assistant:

void Sequence::AddExpectation(const Expectation& expectation) const {
  if (*last_expectation_ != expectation) {
    if (last_expectation_->expectation_base() != NULL) {
      expectation.expectation_base()->immediate_prerequisites_
          += *last_expectation_;
    }
    *last_expectation_ = expectation;
  }
}